

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

void __thiscall
QSqlRelationalTableModelPrivate::translateFieldNames
          (QSqlRelationalTableModelPrivate *this,QSqlRecord *values)

{
  bool bVar1;
  int iVar2;
  int i;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_80;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  lVar3 = 0;
  while( true ) {
    iVar2 = QSqlRecord::count(values);
    if (iVar2 <= lVar3) break;
    QList<QSharedPointer<QRelation>_>::value
              ((QList<QSharedPointer<QRelation>_> *)&local_80,(qsizetype)&this->relations);
    if (local_80.shared == (PrivateShared *)0x0) {
      QSharedPointer<QRelation>::deref((Data *)local_80._8_8_);
    }
    else {
      bVar1 = QRelation::isValid(*(QRelation **)
                                  ((long)&(((this->relations).d.ptr)->value).ptr + lVar4));
      QSharedPointer<QRelation>::deref((Data *)local_80._8_8_);
      if (bVar1) {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        iVar2 = (int)lVar3;
        QSqlRecord::value((QVariant *)&local_58,values,iVar2);
        bVar1 = QSqlRecord::isGenerated(values,iVar2);
        QSqlRecord::field((QSqlField *)&local_80,&this->baseRec,iVar2);
        QSqlRecord::replace(values,iVar2,(QSqlField *)&local_80);
        QSqlField::~QSqlField((QSqlField *)&local_80);
        QSqlRecord::setValue(values,iVar2,(QVariant *)&local_58);
        QSqlRecord::setGenerated(values,iVar2,bVar1);
        QVariant::~QVariant((QVariant *)&local_58);
      }
    }
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlRelationalTableModelPrivate::translateFieldNames(QSqlRecord &values) const
{
    for (int i = 0; i < values.count(); ++i) {
        if (relations.value(i) && relations.at(i)->isValid()) {
            QVariant v = values.value(i);
            bool gen = values.isGenerated(i);
            values.replace(i, baseRec.field(i));
            values.setValue(i, v);
            values.setGenerated(i, gen);
        }
    }
}